

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddAuto.c
# Opt level: O2

DdNode * extraBddSpaceFromFunction(DdManager *dd,DdNode *bF,DdNode *bG)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int index;
  DdNode *pDVar4;
  DdNode *g;
  DdNode *n;
  DdNode *pDVar5;
  DdNode *pDVar6;
  DdNode *bG_00;
  DdNode *g_00;
  DdNode *local_60;
  
  do {
    g_00 = bG;
    bG = bF;
    pDVar6 = (DdNode *)((ulong)bG & 0xfffffffffffffffe);
    if (pDVar6->index == 0x7fffffff) {
      pDVar6 = dd->one;
      if (bG == g_00) {
        return pDVar6;
      }
LAB_0063fdda:
      return (DdNode *)((ulong)pDVar6 ^ 1);
    }
    pDVar5 = (DdNode *)((ulong)g_00 & 0xfffffffffffffffe);
    if (pDVar5->index == 0x7fffffff) {
      pDVar6 = dd->one;
      goto LAB_0063fdda;
    }
    bF = g_00;
  } while ((uint)g_00 < (uint)bG);
  pDVar4 = cuddCacheLookup2(dd,extraBddSpaceFromFunction,bG,g_00);
  if (pDVar4 != (DdNode *)0x0) {
    return pDVar4;
  }
  iVar2 = dd->perm[pDVar6->index];
  iVar3 = dd->perm[pDVar5->index];
  if (iVar3 < iVar2) {
    index = dd->invperm[iVar3];
    pDVar4 = bG;
    local_60 = bG;
  }
  else {
    index = dd->invperm[iVar2];
    pDVar4 = (pDVar6->type).kids.E;
    if (bG == pDVar6) {
      local_60 = (pDVar6->type).kids.T;
    }
    else {
      pDVar4 = (DdNode *)((ulong)pDVar4 ^ 1);
      local_60 = (DdNode *)((ulong)(pDVar6->type).kids.T ^ 1);
    }
  }
  pDVar6 = g_00;
  bG_00 = g_00;
  if (iVar3 <= iVar2) {
    pDVar6 = (pDVar5->type).kids.E;
    if (g_00 == pDVar5) {
      bG_00 = (pDVar5->type).kids.T;
    }
    else {
      pDVar6 = (DdNode *)((ulong)pDVar6 ^ 1);
      bG_00 = (DdNode *)((ulong)(pDVar5->type).kids.T ^ 1);
    }
  }
  pDVar5 = extraBddSpaceFromFunction(dd,pDVar4,pDVar6);
  if (pDVar5 == (DdNode *)0x0) {
    return (DdNode *)0x0;
  }
  piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + 1;
  g = extraBddSpaceFromFunction(dd,local_60,bG_00);
  n = pDVar5;
  if (g == (DdNode *)0x0) goto LAB_0063ffaf;
  piVar1 = (int *)(((ulong)g & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + 1;
  n = cuddBddAndRecur(dd,pDVar5,g);
  if (n != (DdNode *)0x0) {
    piVar1 = (int *)(((ulong)n & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    Cudd_RecursiveDeref(dd,pDVar5);
    Cudd_RecursiveDeref(dd,g);
    pDVar5 = extraBddSpaceFromFunction(dd,pDVar4,bG_00);
    if (pDVar5 == (DdNode *)0x0) goto LAB_0063ffaf;
    piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    g = extraBddSpaceFromFunction(dd,local_60,pDVar6);
    if (g == (DdNode *)0x0) {
      Cudd_RecursiveDeref(dd,n);
      n = pDVar5;
      goto LAB_0063ffaf;
    }
    piVar1 = (int *)(((ulong)g & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    pDVar6 = cuddBddAndRecur(dd,pDVar5,g);
    if (pDVar6 != (DdNode *)0x0) {
      pDVar4 = (DdNode *)((ulong)pDVar6 & 0xfffffffffffffffe);
      pDVar4->ref = pDVar4->ref + 1;
      Cudd_RecursiveDeref(dd,pDVar5);
      Cudd_RecursiveDeref(dd,g);
      pDVar5 = pDVar6;
      if (n == pDVar6) {
LAB_0063ffe5:
        piVar1 = (int *)(((ulong)n & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + -1;
        pDVar4->ref = pDVar4->ref - 1;
        cuddCacheInsert2(dd,extraBddSpaceFromFunction,bG,g_00,pDVar5);
        return pDVar5;
      }
      if (((ulong)pDVar6 & 1) == 0) {
        pDVar5 = cuddUniqueInter(dd,index,pDVar6,n);
        if (pDVar5 != (DdNode *)0x0) goto LAB_0063ffe5;
      }
      else {
        pDVar5 = cuddUniqueInter(dd,index,pDVar4,(DdNode *)((ulong)n ^ 1));
        if (pDVar5 != (DdNode *)0x0) {
          pDVar5 = (DdNode *)((ulong)pDVar5 ^ 1);
          goto LAB_0063ffe5;
        }
      }
      Cudd_RecursiveDeref(dd,n);
      n = pDVar6;
      goto LAB_0063ffaf;
    }
    Cudd_RecursiveDeref(dd,n);
  }
  Cudd_RecursiveDeref(dd,pDVar5);
  n = g;
LAB_0063ffaf:
  Cudd_RecursiveDeref(dd,n);
  return (DdNode *)0x0;
}

Assistant:

DdNode * extraBddSpaceFromFunction( DdManager * dd, DdNode * bF, DdNode * bG )
{
	DdNode * bRes;
	DdNode * bFR, * bGR;

	bFR = Cudd_Regular( bF ); 
	bGR = Cudd_Regular( bG ); 
	if ( cuddIsConstant(bFR) )
	{
		if ( bF == bG )
			return b1;
		else 
			return b0;
	}
	if ( cuddIsConstant(bGR) )
		return b0;
	// both bFunc and bCore are not constants

	// the operation is commutative - normalize the problem
	if ( (unsigned)(ABC_PTRUINT_T)bF > (unsigned)(ABC_PTRUINT_T)bG )
		return extraBddSpaceFromFunction(dd, bG, bF);


    if ( (bRes = cuddCacheLookup2(dd, extraBddSpaceFromFunction, bF, bG)) )
    	return bRes;
	else
	{
		DdNode * bF0, * bF1;
		DdNode * bG0, * bG1;
		DdNode * bTemp1, * bTemp2;
		DdNode * bRes0, * bRes1;
		int LevelF, LevelG;
		int index;

		LevelF = dd->perm[bFR->index];
		LevelG = dd->perm[bGR->index];
		if ( LevelF <= LevelG )
		{
			index = dd->invperm[LevelF];
			if ( bFR != bF )
			{
				bF0 = Cudd_Not( cuddE(bFR) );
				bF1 = Cudd_Not( cuddT(bFR) );
			}
			else
			{
				bF0 = cuddE(bFR);
				bF1 = cuddT(bFR);
			}
		}
		else
		{
			index = dd->invperm[LevelG];
			bF0 = bF1 = bF;
		}

		if ( LevelG <= LevelF )
		{
			if ( bGR != bG )
			{
				bG0 = Cudd_Not( cuddE(bGR) );
				bG1 = Cudd_Not( cuddT(bGR) );
			}
			else
			{
				bG0 = cuddE(bGR);
				bG1 = cuddT(bGR);
			}
		}
		else
			bG0 = bG1 = bG;

		bTemp1 = extraBddSpaceFromFunction( dd, bF0, bG0 );
		if ( bTemp1 == NULL ) 
			return NULL;
		cuddRef( bTemp1 );

		bTemp2 = extraBddSpaceFromFunction( dd, bF1, bG1 );
		if ( bTemp2 == NULL ) 
		{
			Cudd_RecursiveDeref( dd, bTemp1 );
			return NULL;
		}
		cuddRef( bTemp2 );


		bRes0  = cuddBddAndRecur( dd, bTemp1, bTemp2 );
		if ( bRes0 == NULL )
		{
			Cudd_RecursiveDeref( dd, bTemp1 );
			Cudd_RecursiveDeref( dd, bTemp2 );
			return NULL;
		}
		cuddRef( bRes0 );
		Cudd_RecursiveDeref( dd, bTemp1 );
		Cudd_RecursiveDeref( dd, bTemp2 );


		bTemp1  = extraBddSpaceFromFunction( dd, bF0, bG1 );
		if ( bTemp1 == NULL )
		{
			Cudd_RecursiveDeref( dd, bRes0 );
			return NULL;
		}
		cuddRef( bTemp1 );

		bTemp2  = extraBddSpaceFromFunction( dd, bF1, bG0 );
		if ( bTemp2 == NULL )
		{
			Cudd_RecursiveDeref( dd, bRes0 );
			Cudd_RecursiveDeref( dd, bTemp1 );
			return NULL;
		}
		cuddRef( bTemp2 );

		bRes1  = cuddBddAndRecur( dd, bTemp1, bTemp2 );
		if ( bRes1 == NULL )
		{
			Cudd_RecursiveDeref( dd, bRes0 );
			Cudd_RecursiveDeref( dd, bTemp1 );
			Cudd_RecursiveDeref( dd, bTemp2 );
			return NULL;
		}
		cuddRef( bRes1 );
		Cudd_RecursiveDeref( dd, bTemp1 );
		Cudd_RecursiveDeref( dd, bTemp2 );



		// consider the case when Res0 and Res1 are the same node 
		if ( bRes0 == bRes1 )
			bRes = bRes1;
		// consider the case when Res1 is complemented 
		else if ( Cudd_IsComplement(bRes1) ) 
		{
			bRes = cuddUniqueInter(dd, index, Cudd_Not(bRes1), Cudd_Not(bRes0));
			if ( bRes == NULL ) 
			{
				Cudd_RecursiveDeref(dd,bRes0);
				Cudd_RecursiveDeref(dd,bRes1);
				return NULL;
			}
			bRes = Cudd_Not(bRes);
		} 
		else 
		{
			bRes = cuddUniqueInter( dd, index, bRes1, bRes0 );
			if ( bRes == NULL ) 
			{
				Cudd_RecursiveDeref(dd,bRes0);
				Cudd_RecursiveDeref(dd,bRes1);
				return NULL;
			}
		}
		cuddDeref( bRes0 );
		cuddDeref( bRes1 );
			
		// insert the result into cache 
		cuddCacheInsert2(dd, extraBddSpaceFromFunction, bF, bG, bRes);
		return bRes;
	}
}